

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Pivot.c
# Opt level: O2

void Llb_ManLabelLiCones(Aig_Man_t *p)

{
  undefined1 *puVar1;
  void *pvVar2;
  int iVar3;
  
  puVar1 = &p->pConst1->field_0x18;
  *(ulong *)puVar1 = *(ulong *)puVar1 | 0x20;
  for (iVar3 = 0; iVar3 < p->vCis->nSize; iVar3 = iVar3 + 1) {
    pvVar2 = Vec_PtrEntry(p->vCis,iVar3);
    *(byte *)((long)pvVar2 + 0x18) = *(byte *)((long)pvVar2 + 0x18) | 0x20;
  }
  for (iVar3 = 0; iVar3 < p->nRegs; iVar3 = iVar3 + 1) {
    pvVar2 = Vec_PtrEntry(p->vCos,p->nTruePos + iVar3);
    Llb_ManLabelLiCones_rec(p,(Aig_Obj_t *)(*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe));
  }
  return;
}

Assistant:

void Llb_ManLabelLiCones( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    // mark const and PIs
    Aig_ManConst1(p)->fMarkB = 1;
    Aig_ManForEachCi( p, pObj, i )
        pObj->fMarkB = 1;
    // mark cones
    Saig_ManForEachLi( p, pObj, i )
        Llb_ManLabelLiCones_rec( p, Aig_ObjFanin0(pObj) );
}